

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O1

void __thiscall
QTextCursor::insertImage(QTextCursor *this,QTextImageFormat *format,Position alignment)

{
  uint uVar1;
  QTextCursorPrivate *pQVar2;
  QTextDocumentPrivate *pQVar3;
  int iVar4;
  QTextObject *this_00;
  char *__filename;
  long in_FS_OFFSET;
  QStringView str;
  storage_type_conflict local_6a;
  undefined1 local_68 [16];
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 != (QTextCursorPrivate *)0x0) {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
    }
    if (((this->d).d.ptr)->priv != (QTextDocumentPrivate *)0x0) {
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFrameFormat::QTextFrameFormat((QTextFrameFormat *)local_68);
      ::QVariant::QVariant((QVariant *)&local_58,alignment);
      QTextFormat::setProperty((QTextFormat *)local_68,0x800,(QVariant *)&local_58);
      ::QVariant::~QVariant((QVariant *)&local_58);
      pQVar2 = (this->d).d.ptr;
      if ((pQVar2 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      this_00 = QTextDocumentPrivate::createObject
                          (((this->d).d.ptr)->priv,(QTextFormat *)local_68,-1);
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFormat::QTextFormat((QTextFormat *)&local_58,(QTextFormat *)format);
      iVar4 = QTextObject::objectIndex(this_00);
      QTextFormat::setObjectIndex((QTextFormat *)&local_58,iVar4);
      pQVar2 = (this->d).d.ptr;
      if ((pQVar2 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      pQVar2 = (this->d).d.ptr;
      pQVar3 = pQVar2->priv;
      iVar4 = pQVar3->editBlock;
      uVar1 = iVar4 + 1;
      __filename = (char *)(ulong)uVar1;
      pQVar3->editBlock = uVar1;
      if (iVar4 == 0) {
        pQVar3->revision = pQVar3->revision + 1;
      }
      if ((pQVar2 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      QTextCursorPrivate::remove((this->d).d.ptr,__filename);
      pQVar2 = (this->d).d.ptr;
      if ((pQVar2 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      iVar4 = QTextFormatCollection::indexForFormat
                        (&((this->d).d.ptr)->priv->formats,(QTextFormat *)&local_58);
      pQVar2 = (this->d).d.ptr;
      if ((pQVar2 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      pQVar2 = (this->d).d.ptr;
      pQVar3 = pQVar2->priv;
      if ((pQVar2 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      local_6a = L'￼';
      str.m_data = &local_6a;
      str.m_size = 1;
      QTextDocumentPrivate::insert(pQVar3,((this->d).d.ptr)->position,str,iVar4);
      pQVar2 = (this->d).d.ptr;
      if ((pQVar2 != (QTextCursorPrivate *)0x0) &&
         ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1)) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      }
      QTextDocumentPrivate::endEditBlock(((this->d).d.ptr)->priv);
      QTextFormat::~QTextFormat((QTextFormat *)&local_58);
      QTextFormat::~QTextFormat((QTextFormat *)local_68);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursor::insertImage(const QTextImageFormat &format, QTextFrameFormat::Position alignment)
{
    if (!d || !d->priv)
        return;

    QTextFrameFormat ffmt;
    ffmt.setPosition(alignment);
    QTextObject *obj = d->priv->createObject(ffmt);

    QTextImageFormat fmt = format;
    fmt.setObjectIndex(obj->objectIndex());

    d->priv->beginEditBlock();
    d->remove();
    const int idx = d->priv->formatCollection()->indexForFormat(fmt);
    d->priv->insert(d->position, QChar(QChar::ObjectReplacementCharacter), idx);
    d->priv->endEditBlock();
}